

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::benchmarkFailed(ConsoleReporter *this,StringRef error)

{
  ColourImpl *pCVar1;
  ColourGuard *rhs;
  TablePrinter *pTVar2;
  char local_4d [13];
  ColourGuard local_40;
  undefined1 local_30 [8];
  ColourGuard guard;
  ConsoleReporter *this_local;
  StringRef error_local;
  
  error_local.m_start = (char *)error.m_size;
  this_local = (ConsoleReporter *)error.m_start;
  guard._8_8_ = this;
  pCVar1 = Detail::unique_ptr<Catch::ColourImpl>::operator->
                     (&(this->super_StreamingReporterBase).super_ReporterBase.m_colour);
  ColourImpl::guardColour((ColourImpl *)&local_40,(Code)pCVar1);
  rhs = ColourImpl::ColourGuard::engage
                  (&local_40,(this->super_StreamingReporterBase).super_ReporterBase.m_stream);
  ColourImpl::ColourGuard::ColourGuard((ColourGuard *)local_30,rhs);
  ColourImpl::ColourGuard::~ColourGuard(&local_40);
  pTVar2 = Detail::unique_ptr<Catch::TablePrinter>::operator*(&this->m_tablePrinter);
  pTVar2 = Catch::operator<<(pTVar2,(char (*) [19])"Benchmark failed (");
  pTVar2 = Catch::operator<<(pTVar2,(StringRef *)&this_local);
  local_4d[0] = ')';
  pTVar2 = Catch::operator<<(pTVar2,local_4d);
  pTVar2 = Catch::operator<<(pTVar2);
  Catch::operator<<(pTVar2);
  ColourImpl::ColourGuard::~ColourGuard((ColourGuard *)local_30);
  return;
}

Assistant:

void ConsoleReporter::benchmarkFailed( StringRef error ) {
    auto guard = m_colour->guardColour( Colour::Red ).engage( m_stream );
    (*m_tablePrinter)
        << "Benchmark failed (" << error << ')'
        << ColumnBreak() << RowBreak();
}